

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O2

void __thiscall DPlayerMenu::Init(DPlayerMenu *this,DMenu *parent,FListMenuDescriptor *desc)

{
  PType *pPVar1;
  ulong uVar2;
  undefined8 uVar3;
  uint uVar4;
  int iVar5;
  uint32 uVar6;
  FListMenuItem *pFVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  undefined1 local_70 [20];
  FName local_5c;
  FName local_58;
  FName local_54;
  FName local_50;
  FName local_4c;
  FName local_48;
  FName local_44;
  FName local_40;
  FName local_3c;
  FName local_38;
  FName local_34;
  
  DListMenu::Init(&this->super_DListMenu,parent,desc);
  PickPlayerClass(this);
  this->mRotation = 0;
  local_34.Index = 0x20c;
  pFVar7 = DListMenu::GetItem(&this->super_DListMenu,&local_34);
  if (pFVar7 != (FListMenuItem *)0x0) {
    (*pFVar7->_vptr_FListMenuItem[10])(pFVar7,0x10001,0);
    (*pFVar7->_vptr_FListMenuItem[10])(pFVar7,0x10004,1);
    (*pFVar7->_vptr_FListMenuItem[10])(pFVar7,0x10005,1);
    uVar4 = userinfo_t::GetPlayerClassNum
                      ((userinfo_t *)(&DAT_017dbfb8 + (long)consoleplayer * 0x2a0));
    (*pFVar7->_vptr_FListMenuItem[10])(pFVar7,0x10003,(ulong)uVar4);
    if ((this->PlayerClass != (FPlayerClass *)0x0) &&
       (((this->PlayerClass->Type->super_PClassActor).super_PClass.Defaults[0x1c8] & 0x20) == 0)) {
      iVar5 = userinfo_t::GetPlayerClassNum
                        ((userinfo_t *)(&DAT_017dbfb8 + (long)consoleplayer * 0x2a0));
      if (iVar5 != -1) {
        uVar4 = userinfo_t::GetSkin((userinfo_t *)(&DAT_017dbfb8 + (long)consoleplayer * 0x2a0));
        (*pFVar7->_vptr_FListMenuItem[10])(pFVar7,0x10002,(ulong)uVar4);
      }
    }
  }
  local_38.Index = 0x202;
  pFVar7 = DListMenu::GetItem(&this->super_DListMenu,&local_38);
  if (pFVar7 != (FListMenuItem *)0x0) {
    (*pFVar7->_vptr_FListMenuItem[8])(pFVar7,0,::name.Value);
  }
  local_3c.Index = 0x203;
  pFVar7 = DListMenu::GetItem(&this->super_DListMenu,&local_3c);
  if (pFVar7 != (FListMenuItem *)0x0) {
    lVar9 = 0;
    (*pFVar7->_vptr_FListMenuItem[8])(pFVar7,0,"None");
    uVar10 = 0;
    while (uVar10 < Teams.Count) {
      uVar10 = uVar10 + 1;
      pcVar8 = FTeam::GetName((FTeam *)((long)&(Teams.Array)->m_iPlayerCount + lVar9));
      (*pFVar7->_vptr_FListMenuItem[8])(pFVar7,uVar10 & 0xffffffff,pcVar8);
      lVar9 = lVar9 + 0x38;
    }
    uVar10 = (ulong)(team.Value + 1);
    if (team.Value == 0xff) {
      uVar10 = 0;
    }
    (*pFVar7->_vptr_FListMenuItem[10])(pFVar7,0,uVar10);
  }
  iVar5 = userinfo_t::GetColorSet((userinfo_t *)(&DAT_017dbfb8 + (long)consoleplayer * 0x2a0));
  uVar6 = userinfo_t::GetColor((userinfo_t *)(&DAT_017dbfb8 + (long)consoleplayer * 0x2a0));
  UpdateColorsets(this);
  local_40.Index = 0x205;
  pFVar7 = DListMenu::GetItem(&this->super_DListMenu,&local_40);
  if (pFVar7 != (FListMenuItem *)0x0) {
    (*pFVar7->_vptr_FListMenuItem[0xc])(pFVar7,(ulong)(iVar5 == -1));
    (*pFVar7->_vptr_FListMenuItem[10])(pFVar7,0,(ulong)(uVar6 >> 0x10 & 0xff));
  }
  local_44.Index = 0x206;
  pFVar7 = DListMenu::GetItem(&this->super_DListMenu,&local_44);
  if (pFVar7 != (FListMenuItem *)0x0) {
    (*pFVar7->_vptr_FListMenuItem[0xc])(pFVar7,(ulong)(iVar5 == -1));
    (*pFVar7->_vptr_FListMenuItem[10])(pFVar7,0,(ulong)(uVar6 >> 8 & 0xff));
  }
  local_48.Index = 0x207;
  pFVar7 = DListMenu::GetItem(&this->super_DListMenu,&local_48);
  if (pFVar7 != (FListMenuItem *)0x0) {
    (*pFVar7->_vptr_FListMenuItem[0xc])(pFVar7,(ulong)(iVar5 == -1));
    (*pFVar7->_vptr_FListMenuItem[10])(pFVar7,0,(ulong)(uVar6 & 0xff));
  }
  local_4c.Index = 5;
  pFVar7 = DListMenu::GetItem(&this->super_DListMenu,&local_4c);
  if (pFVar7 != (FListMenuItem *)0x0) {
    if (PlayerClasses.Count == 1) {
      GetPrintableDisplayName((PClassPlayerPawn *)local_70);
      uVar4 = 0;
      (*pFVar7->_vptr_FListMenuItem[8])(pFVar7,0,local_70._0_8_);
      FString::~FString((FString *)local_70);
    }
    else {
      local_70._8_8_ = this;
      if (gameinfo.norandomplayerclass == false) {
        (*pFVar7->_vptr_FListMenuItem[8])(pFVar7,0,"Random");
      }
      uVar10 = 0;
      while (uVar10 < PlayerClasses.Count) {
        GetPrintableDisplayName((PClassPlayerPawn *)local_70);
        uVar3 = local_70._0_8_;
        FString::~FString((FString *)local_70);
        uVar2 = uVar10;
        if (gameinfo.norandomplayerclass == false) {
          uVar2 = uVar10 + 1;
        }
        (*pFVar7->_vptr_FListMenuItem[8])(pFVar7,uVar2 & 0xffffffff,uVar3);
        uVar10 = uVar10 + 1;
      }
      iVar5 = userinfo_t::GetPlayerClassNum
                        ((userinfo_t *)(&DAT_017dbfb8 + (long)consoleplayer * 0x2a0));
      uVar4 = (uint)(byte)(iVar5 < 0 | gameinfo.norandomplayerclass ^ 1U) + iVar5;
      this = (DPlayerMenu *)local_70._8_8_;
    }
    (*pFVar7->_vptr_FListMenuItem[10])(pFVar7,0,(ulong)uVar4);
  }
  UpdateSkins(this);
  local_50.Index = 0x209;
  pFVar7 = DListMenu::GetItem(&this->super_DListMenu,&local_50);
  if (pFVar7 != (FListMenuItem *)0x0) {
    uVar4 = userinfo_t::GetGender((userinfo_t *)(&DAT_017dbfb8 + (long)consoleplayer * 0x2a0));
    (*pFVar7->_vptr_FListMenuItem[10])(pFVar7,0,(ulong)uVar4);
  }
  local_54.Index = 0x20a;
  pFVar7 = DListMenu::GetItem(&this->super_DListMenu,&local_54);
  if (pFVar7 != (FListMenuItem *)0x0) {
    (*pFVar7->_vptr_FListMenuItem[10])(pFVar7,0,(ulong)(uint)(int)autoaim.Value);
  }
  local_58.Index = 0x20b;
  pFVar7 = DListMenu::GetItem(&this->super_DListMenu,&local_58);
  if (pFVar7 != (FListMenuItem *)0x0) {
    (*pFVar7->_vptr_FListMenuItem[10])(pFVar7,0,(ulong)neverswitchonpickup.Value);
  }
  local_5c.Index = 0x22d;
  pFVar7 = DListMenu::GetItem(&this->super_DListMenu,&local_5c);
  if (pFVar7 != (FListMenuItem *)0x0) {
    (*pFVar7->_vptr_FListMenuItem[10])(pFVar7,0,(ulong)cl_run.Value);
  }
  pPVar1 = (((PClass *)this)->super_PNativeStruct).super_PStruct.super_PNamedType.
           super_PCompoundType.super_PType.HashNext;
  if (*(int *)&(pPVar1->Symbols).ParentSymbolTable < 0) {
    *(undefined4 *)&(pPVar1->Symbols).ParentSymbolTable = 1;
  }
  return;
}

Assistant:

void DPlayerMenu::Init(DMenu *parent, FListMenuDescriptor *desc)
{
	FListMenuItem *li;

	Super::Init(parent, desc);
	PickPlayerClass();
	mRotation = 0;

	li = GetItem(NAME_Playerdisplay);
	if (li != NULL)
	{
		li->SetValue(FListMenuItemPlayerDisplay::PDF_ROTATION, 0);
		li->SetValue(FListMenuItemPlayerDisplay::PDF_MODE, 1);
		li->SetValue(FListMenuItemPlayerDisplay::PDF_TRANSLATE, 1);
		li->SetValue(FListMenuItemPlayerDisplay::PDF_CLASS, players[consoleplayer].userinfo.GetPlayerClassNum());
		if (PlayerClass != NULL && !(GetDefaultByType (PlayerClass->Type)->flags4 & MF4_NOSKIN) &&
			players[consoleplayer].userinfo.GetPlayerClassNum() != -1)
		{
			li->SetValue(FListMenuItemPlayerDisplay::PDF_SKIN, players[consoleplayer].userinfo.GetSkin());
		}
	}

	li = GetItem(NAME_Playerbox);
	if (li != NULL)
	{
		li->SetString(0, name);
	}

	li = GetItem(NAME_Team);
	if (li != NULL)
	{
		li->SetString(0, "None");
		for(unsigned i=0;i<Teams.Size(); i++)
		{
			li->SetString(i+1, Teams[i].GetName());
		}
		li->SetValue(0, team == TEAM_NONE? 0 : team + 1);
	}

	int mycolorset = players[consoleplayer].userinfo.GetColorSet();
	int color = players[consoleplayer].userinfo.GetColor();

	UpdateColorsets();

	li = GetItem(NAME_Red);
	if (li != NULL)
	{
		li->Enable(mycolorset == -1);
		li->SetValue(0, RPART(color));
	}

	li = GetItem(NAME_Green);
	if (li != NULL)
	{
		li->Enable(mycolorset == -1);
		li->SetValue(0, GPART(color));
	}

	li = GetItem(NAME_Blue);
	if (li != NULL)
	{
		li->Enable(mycolorset == -1);
		li->SetValue(0, BPART(color));
	}

	li = GetItem(NAME_Class);
	if (li != NULL)
	{
		if (PlayerClasses.Size() == 1)
		{
			li->SetString(0, GetPrintableDisplayName(PlayerClasses[0].Type));
			li->SetValue(0, 0);
		}
		else
		{
			// [XA] Remove the "Random" option if the relevant gameinfo flag is set.
			if(!gameinfo.norandomplayerclass)
				li->SetString(0, "Random");
			for(unsigned i=0; i< PlayerClasses.Size(); i++)
			{
				const char *cls = GetPrintableDisplayName(PlayerClasses[i].Type);
				li->SetString(gameinfo.norandomplayerclass ? i : i+1, cls);
			}
			int pclass = players[consoleplayer].userinfo.GetPlayerClassNum();
			li->SetValue(0, gameinfo.norandomplayerclass && pclass >= 0 ? pclass : pclass + 1);
		}
	}

	UpdateSkins();

	li = GetItem(NAME_Gender);
	if (li != NULL)
	{
		li->SetValue(0, players[consoleplayer].userinfo.GetGender());
	}

	li = GetItem(NAME_Autoaim);
	if (li != NULL)
	{
		li->SetValue(0, (int)autoaim);
	}

	li = GetItem(NAME_Switch);
	if (li != NULL)
	{
		li->SetValue(0, neverswitchonpickup);
	}

	li = GetItem(NAME_AlwaysRun);
	if (li != NULL)
	{
		li->SetValue(0, cl_run);
	}

	if (mDesc->mSelectedItem < 0) mDesc->mSelectedItem = 1;

}